

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCCommon.h
# Opt level: O2

void SL::Screen_Capture::
     ProcessCapture<SL::Screen_Capture::CaptureData<std::function<void(SL::Screen_Capture::Image_const&,SL::Screen_Capture::Monitor_const&)>,std::function<void(SL::Screen_Capture::Image_const*,SL::Screen_Capture::MousePoint_const&)>,std::function<std::vector<SL::Screen_Capture::Monitor,std::allocator<SL::Screen_Capture::Monitor>>()>>,SL::Screen_Capture::Monitor>
               (CaptureData<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>,_std::function<void_(const_SL::Screen_Capture::Image_*,_const_SL::Screen_Capture::MousePoint_&)>,_std::function<std::vector<SL::Screen_Capture::Monitor,_std::allocator<SL::Screen_Capture::Monitor>_>_()>_>
                *data,BaseFrameProcessor *base,Monitor *mointor,uchar *startsrc,int srcrowstride)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  ImageRect *r;
  pointer imgrect;
  uchar *__dest;
  Image wholeimg;
  vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_> imgdifs;
  Image difimg;
  Image oldimg;
  ImageRect local_c0;
  function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)> *local_b0;
  Image local_a8;
  _Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
  local_88;
  Image local_70;
  Image local_50;
  
  local_c0.left = 0;
  local_c0.top = 0;
  local_c0.bottom = Height(mointor);
  local_c0.right = Width(mointor);
  iVar1 = Width(mointor);
  iVar1 = iVar1 << 2;
  if ((data->OnNewFrame).super__Function_base._M_manager != (_Manager_type)0x0) {
    CreateImage(&local_a8,&local_c0,srcrowstride,(ImageBGRA *)startsrc);
    local_a8.isContiguous = iVar1 == srcrowstride;
    std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>::
    operator()(&data->OnNewFrame,&local_a8,mointor);
  }
  if ((data->OnFrameChanged).super__Function_base._M_manager != (_Manager_type)0x0) {
    if (base->FirstRun == true) {
      CreateImage(&local_a8,&local_c0,srcrowstride,(ImageBGRA *)startsrc);
      local_a8.isContiguous = iVar1 == srcrowstride;
      std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>::
      operator()(&data->OnFrameChanged,&local_a8,mointor);
      base->FirstRun = false;
    }
    else {
      local_b0 = &data->OnFrameChanged;
      CreateImage(&local_a8,&local_c0,srcrowstride,(ImageBGRA *)startsrc);
      CreateImage(&local_50,&local_c0,0,
                  (ImageBGRA *)
                  (base->ImageBuffer)._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      GetDifs((vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
               *)&local_88,&local_50,&local_a8);
      for (imgrect = local_88._M_impl.super__Vector_impl_data._M_start;
          imgrect != local_88._M_impl.super__Vector_impl_data._M_finish; imgrect = imgrect + 1) {
        CreateImage(&local_70,imgrect,srcrowstride,
                    (ImageBGRA *)
                    (startsrc + (long)imgrect->top * (long)srcrowstride + (long)imgrect->left * 4));
        local_70.isContiguous = false;
        std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>
        ::operator()(local_b0,&local_70,mointor);
      }
      std::
      _Vector_base<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>::
      ~_Vector_base(&local_88);
    }
    __dest = (base->ImageBuffer)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (iVar1 == srcrowstride) {
      iVar1 = Height(mointor);
      memcpy(__dest,startsrc,(long)(iVar1 * srcrowstride));
    }
    else {
      lVar3 = 0;
      while( true ) {
        iVar2 = Height(mointor);
        if (iVar2 <= lVar3) break;
        memcpy(__dest,startsrc,(long)iVar1);
        lVar3 = lVar3 + 1;
        __dest = __dest + iVar1;
        startsrc = startsrc + srcrowstride;
      }
    }
  }
  return;
}

Assistant:

void ProcessCapture(const F &data, BaseFrameProcessor &base, const C &mointor, const unsigned char *startsrc, int srcrowstride)
    {
        ImageRect imageract;
        imageract.left = 0;
        imageract.top = 0;
        imageract.bottom = Height(mointor);
        imageract.right = Width(mointor);
        const auto sizeofimgbgra = static_cast<int>(sizeof(ImageBGRA));
        const auto startimgsrc = reinterpret_cast<const ImageBGRA *>(startsrc);
        auto dstrowstride = sizeofimgbgra * Width(mointor);
        if (data.OnNewFrame) { // each frame we still let the caller know if asked for
            auto wholeimg = CreateImage(imageract, srcrowstride, startimgsrc);
            wholeimg.isContiguous = dstrowstride == srcrowstride;
            data.OnNewFrame(wholeimg, mointor);
        }
        if (data.OnFrameChanged) { // difs are needed, which means that we must hold the last known image in memory for comparisons...
            if (base.FirstRun) {
                // first time through, just send the whole image
                auto wholeimg = CreateImage(imageract, srcrowstride, startimgsrc);
                wholeimg.isContiguous = dstrowstride == srcrowstride;
                data.OnFrameChanged(wholeimg, mointor);
                base.FirstRun = false;
            }
            else {
                // user wants difs, lets do it!
                auto newimg = CreateImage(imageract, srcrowstride, startimgsrc);
                auto oldimg = CreateImage(imageract, 0, reinterpret_cast<const ImageBGRA *>(base.ImageBuffer.get()));
                auto imgdifs = GetDifs(oldimg, newimg);

                for (auto &r : imgdifs) {
                    auto leftoffset = r.left * sizeofimgbgra;
                    auto thisstartsrc = startsrc + leftoffset + (r.top * srcrowstride);

                    auto difimg = CreateImage(r, srcrowstride, reinterpret_cast<const ImageBGRA *>(thisstartsrc));
                    difimg.isContiguous = false;
                    data.OnFrameChanged(difimg, mointor);
                }
            }
            auto startdst = base.ImageBuffer.get(); 
            assert(base.ImageBufferSize >= dstrowstride * Height(mointor));
            if (dstrowstride == srcrowstride) { // no need for multiple calls, there is no padding here 
                memcpy(startdst, startsrc, dstrowstride * Height(mointor));
            }
            else { 
                for (auto i = 0; i < Height(mointor); i++) {
                    memcpy(startdst + (i * dstrowstride), startsrc + (i * srcrowstride), dstrowstride);
                }
            }
        }
    }